

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O2

void boost::xpressive::detail::
     make_simple_repeat<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>>
               (quant_spec *spec,
               sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *seq,matcher_wrapper<boost::xpressive::detail::any_matcher> *xpr)

{
  detail adStack_68 [4];
  undefined8 local_64;
  size_t local_58;
  undefined1 local_50;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (spec->greedy_ == true) {
    local_58 = (seq->width_).value_;
    local_64._0_4_ = spec->min_;
    local_64._4_4_ = spec->max_;
    local_50 = 0;
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<true>>>
              (&local_48,adStack_68,
               (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,_mpl_::bool_<true>_>
                *)xpr);
  }
  else {
    local_58 = (seq->width_).value_;
    local_64._0_4_ = spec->min_;
    local_64._4_4_ = spec->max_;
    local_50 = 0;
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<false>>>
              (&local_48,adStack_68,
               (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,_mpl_::bool_<false>_>
                *)xpr);
  }
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(seq,&local_48);
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~sequence(&local_48);
  return;
}

Assistant:

inline void
make_simple_repeat(quant_spec const &spec, sequence<BidiIter> &seq, Xpr const &xpr)
{
    if(spec.greedy_)
    {
        simple_repeat_matcher<Xpr, mpl::true_> quant(xpr, spec.min_, spec.max_, seq.width().value());
        seq = make_dynamic<BidiIter>(quant);
    }
    else
    {
        simple_repeat_matcher<Xpr, mpl::false_> quant(xpr, spec.min_, spec.max_, seq.width().value());
        seq = make_dynamic<BidiIter>(quant);
    }
}